

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *data)

{
  uint uVar1;
  REF_STATUS RVar2;
  void *send;
  void *recv;
  void *__ptr;
  void *recv_00;
  void *send_00;
  undefined4 *__ptr_00;
  undefined8 local_138;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT request;
  REF_INT local;
  REF_GLOB global;
  REF_INT nodes [27];
  int local_84;
  REF_INT cell_node;
  REF_LONG *b_data;
  REF_LONG *a_data;
  REF_GLOB *b_nodes;
  REF_GLOB *a_nodes;
  REF_INT *a_cell;
  REF_INT *a_next;
  REF_INT part;
  REF_INT cell;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_MPI ref_mpi;
  REF_LONG *data_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  a_size = &ref_node->ref_mpi->n;
  if (((REF_MPI)a_size)->n < 2) {
    ref_cell_local._4_4_ = 0;
  }
  else {
    ref_mpi = (REF_MPI)data;
    data_local = (REF_LONG *)ref_node;
    ref_node_local = (REF_NODE)ref_cell;
    if (((REF_MPI)a_size)->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x572,
             "ref_cell_ghost_long","malloc a_size of REF_INT negative");
      ref_cell_local._4_4_ = 1;
    }
    else {
      b_size = (REF_INT *)malloc((long)((REF_MPI)a_size)->n << 2);
      if (b_size == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x572,"ref_cell_ghost_long","malloc a_size of REF_INT NULL");
        ref_cell_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *a_size;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          b_size[ref_private_macro_code_rss] = 0;
        }
        if (*a_size < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x573,"ref_cell_ghost_long","malloc b_size of REF_INT negative");
          ref_cell_local._4_4_ = 1;
        }
        else {
          _b_total = (REF_INT *)malloc((long)*a_size << 2);
          if (_b_total == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x573,"ref_cell_ghost_long","malloc b_size of REF_INT NULL");
            ref_cell_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < *a_size;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              _b_total[ref_private_macro_code_rss_1] = 0;
            }
            for (a_next._4_4_ = 0; a_next._4_4_ < *(int *)((long)&ref_node_local->part + 4);
                a_next._4_4_ = a_next._4_4_ + 1) {
              if (((-1 < a_next._4_4_) && (a_next._4_4_ < *(int *)((long)&ref_node_local->part + 4))
                  ) && (*(int *)((long)ref_node_local->real +
                                (long)(ref_node_local->blank * a_next._4_4_) * 4) != -1)) {
                uVar1 = ref_cell_part((REF_CELL)ref_node_local,(REF_NODE)data_local,a_next._4_4_,
                                      (REF_INT *)&a_next);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x576,"ref_cell_ghost_long",(ulong)uVar1,"cell part");
                  return uVar1;
                }
                if ((int)a_next != a_size[1]) {
                  b_size[(int)a_next] = b_size[(int)a_next] + 1;
                }
              }
            }
            uVar1 = ref_mpi_alltoall((REF_MPI)a_size,b_size,_b_total,1);
            if (uVar1 == 0) {
              cell = 0;
              for (a_next._0_4_ = 0; (int)a_next < *a_size; a_next._0_4_ = (int)a_next + 1) {
                cell = b_size[(int)a_next] + cell;
              }
              if (*(int *)&ref_node_local->field_0xc * cell < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,0x57f,"ref_cell_ghost_long","malloc a_nodes of REF_GLOB negative");
                ref_cell_local._4_4_ = 1;
              }
              else {
                send = malloc((long)(*(int *)&ref_node_local->field_0xc * cell) << 3);
                if (send == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x57f,"ref_cell_ghost_long","malloc a_nodes of REF_GLOB NULL");
                  ref_cell_local._4_4_ = 2;
                }
                else if (cell < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x580,"ref_cell_ghost_long","malloc a_data of REF_LONG negative");
                  ref_cell_local._4_4_ = 1;
                }
                else {
                  recv = malloc((long)cell << 3);
                  if (recv == (void *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                           ,0x580,"ref_cell_ghost_long","malloc a_data of REF_LONG NULL");
                    ref_cell_local._4_4_ = 2;
                  }
                  else if (cell < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                           ,0x581,"ref_cell_ghost_long","malloc a_cell of REF_INT negative");
                    ref_cell_local._4_4_ = 1;
                  }
                  else {
                    __ptr = malloc((long)cell << 2);
                    if (__ptr == (void *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                             ,0x581,"ref_cell_ghost_long","malloc a_cell of REF_INT NULL");
                      ref_cell_local._4_4_ = 2;
                    }
                    else {
                      part = 0;
                      for (a_next._0_4_ = 0; (int)a_next < *a_size; a_next._0_4_ = (int)a_next + 1)
                      {
                        part = _b_total[(int)a_next] + part;
                      }
                      if (*(int *)&ref_node_local->field_0xc * part < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                               ,0x585,"ref_cell_ghost_long","malloc b_nodes of REF_GLOB negative");
                        ref_cell_local._4_4_ = 1;
                      }
                      else {
                        recv_00 = malloc((long)(*(int *)&ref_node_local->field_0xc * part) << 3);
                        if (recv_00 == (void *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                 ,0x585,"ref_cell_ghost_long","malloc b_nodes of REF_GLOB NULL");
                          ref_cell_local._4_4_ = 2;
                        }
                        else if (part < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                 ,0x586,"ref_cell_ghost_long","malloc b_data of REF_LONG negative");
                          ref_cell_local._4_4_ = 1;
                        }
                        else {
                          send_00 = malloc((long)part << 3);
                          if (send_00 == (void *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                   ,0x586,"ref_cell_ghost_long","malloc b_data of REF_LONG NULL");
                            ref_cell_local._4_4_ = 2;
                          }
                          else if (*a_size < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                   ,0x588,"ref_cell_ghost_long","malloc a_next of REF_INT negative")
                            ;
                            ref_cell_local._4_4_ = 1;
                          }
                          else {
                            __ptr_00 = (undefined4 *)malloc((long)*a_size << 2);
                            if (__ptr_00 == (undefined4 *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                     ,0x588,"ref_cell_ghost_long","malloc a_next of REF_INT NULL");
                              ref_cell_local._4_4_ = 2;
                            }
                            else {
                              *__ptr_00 = 0;
                              for (a_next._0_4_ = 1; (int)a_next < *a_size;
                                  a_next._0_4_ = (int)a_next + 1) {
                                __ptr_00[(int)a_next] =
                                     __ptr_00[(int)a_next + -1] + b_size[(int)a_next + -1];
                              }
                              for (a_next._4_4_ = 0;
                                  a_next._4_4_ < *(int *)((long)&ref_node_local->part + 4);
                                  a_next._4_4_ = a_next._4_4_ + 1) {
                                RVar2 = ref_cell_nodes((REF_CELL)ref_node_local,a_next._4_4_,
                                                       (REF_INT *)&global);
                                if (RVar2 == 0) {
                                  uVar1 = ref_cell_part((REF_CELL)ref_node_local,
                                                        (REF_NODE)data_local,a_next._4_4_,
                                                        (REF_INT *)&a_next);
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                           ,0x58e,"ref_cell_ghost_long",(ulong)uVar1,"cell part");
                                    return uVar1;
                                  }
                                  if ((int)a_next != a_size[1]) {
                                    *(int *)((long)__ptr + (long)(int)__ptr_00[(int)a_next] * 4) =
                                         a_next._4_4_;
                                    for (local_84 = 0; local_84 < *(int *)&ref_node_local->field_0xc
                                        ; local_84 = local_84 + 1) {
                                      if (((nodes[(long)local_84 + -2] < 0) ||
                                          (*(int *)((long)data_local + 4) <=
                                           nodes[(long)local_84 + -2])) ||
                                         (*(long *)(data_local[2] +
                                                   (long)nodes[(long)local_84 + -2] * 8) < 0)) {
                                        local_138 = 0xffffffffffffffff;
                                      }
                                      else {
                                        local_138 = *(undefined8 *)
                                                     (data_local[2] +
                                                     (long)nodes[(long)local_84 + -2] * 8);
                                      }
                                      *(undefined8 *)
                                       ((long)send +
                                       (long)(local_84 +
                                             *(int *)&ref_node_local->field_0xc *
                                             __ptr_00[(int)a_next]) * 8) = local_138;
                                    }
                                    __ptr_00[(int)a_next] = __ptr_00[(int)a_next] + 1;
                                  }
                                }
                              }
                              uVar1 = ref_mpi_alltoallv((REF_MPI)a_size,send,b_size,recv_00,_b_total
                                                        ,*(REF_INT *)&ref_node_local->field_0xc,2);
                              if (uVar1 == 0) {
                                for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < part;
                                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                  for (local_84 = 0; local_84 < *(int *)&ref_node_local->field_0xc;
                                      local_84 = local_84 + 1) {
                                    _request = *(REF_GLOB *)
                                                ((long)recv_00 +
                                                (long)(local_84 +
                                                      *(int *)&ref_node_local->field_0xc *
                                                      ref_malloc_init_i_1) * 8);
                                    uVar1 = ::ref_node_local((REF_NODE)data_local,_request,
                                                             &ref_malloc_init_i);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                             ,0x5a1,"ref_cell_ghost_long",(ulong)uVar1,"local");
                                      return uVar1;
                                    }
                                    nodes[(long)local_84 + -2] = ref_malloc_init_i;
                                  }
                                  uVar1 = ref_cell_with((REF_CELL)ref_node_local,(REF_INT *)&global,
                                                        (REF_INT *)((long)&a_next + 4));
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                           ,0x5a4,"ref_cell_ghost_long",(ulong)uVar1,"find cell");
                                    return uVar1;
                                  }
                                  *(undefined8 *)((long)send_00 + (long)ref_malloc_init_i_1 * 8) =
                                       *(undefined8 *)(&ref_mpi->n + (long)a_next._4_4_ * 2);
                                }
                                uVar1 = ref_mpi_alltoallv((REF_MPI)a_size,send_00,_b_total,recv,
                                                          b_size,1,2);
                                if (uVar1 == 0) {
                                  for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < cell;
                                      ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                    *(undefined8 *)
                                     (&ref_mpi->n +
                                     (long)*(int *)((long)__ptr + (long)ref_malloc_init_i_1 * 4) * 2
                                     ) = *(undefined8 *)((long)recv + (long)ref_malloc_init_i_1 * 8)
                                    ;
                                  }
                                  if (__ptr_00 != (undefined4 *)0x0) {
                                    free(__ptr_00);
                                  }
                                  if (send_00 != (void *)0x0) {
                                    free(send_00);
                                  }
                                  if (recv_00 != (void *)0x0) {
                                    free(recv_00);
                                  }
                                  if (__ptr != (void *)0x0) {
                                    free(__ptr);
                                  }
                                  if (recv != (void *)0x0) {
                                    free(recv);
                                  }
                                  if (send != (void *)0x0) {
                                    free(send);
                                  }
                                  if (_b_total != (REF_INT *)0x0) {
                                    free(_b_total);
                                  }
                                  if (b_size != (REF_INT *)0x0) {
                                    free(b_size);
                                  }
                                  ref_cell_local._4_4_ = 0;
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                         ,0x5aa,"ref_cell_ghost_long",(ulong)uVar1,
                                         "alltoallv return data");
                                  ref_cell_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                       ,0x59c,"ref_cell_ghost_long",(ulong)uVar1,
                                       "alltoallv requested nodes");
                                ref_cell_local._4_4_ = uVar1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x57b,"ref_cell_ghost_long",(ulong)uVar1,"alltoall sizes");
              ref_cell_local._4_4_ = uVar1;
            }
          }
        }
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell, REF_NODE ref_node,
                                       REF_LONG *data) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT cell;
  REF_INT part;
  REF_INT *a_next, *a_cell;
  REF_GLOB *a_nodes, *b_nodes;
  REF_LONG *a_data, *b_data;

  REF_INT cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_INT local;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, ref_cell_node_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_LONG);
  ref_malloc(a_cell, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, ref_cell_node_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_LONG);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_cell[a_next[part]] = cell;
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        a_nodes[cell_node + ref_cell_node_per(ref_cell) * a_next[part]] =
            ref_node_global(ref_node, nodes[cell_node]);
      }
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size,
                        ref_cell_node_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      global = b_nodes[cell_node + ref_cell_node_per(ref_cell) * request];
      RSS(ref_node_local(ref_node, global, &(local)), "local");
      nodes[cell_node] = local;
    }
    RSS(ref_cell_with(ref_cell, nodes, &cell), "find cell");
    b_data[request] = data[cell];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_LONG_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_cell[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_cell);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}